

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test.cc
# Opt level: O2

string * __thiscall
leveldb::DBTest::AllEntriesFor_abi_cxx11_
          (string *__return_storage_ptr__,DBTest *this,Slice *user_key)

{
  ulong uVar1;
  Comparator *pCVar2;
  bool bVar3;
  char *pcVar4;
  int iVar5;
  Iterator *pIVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong extraout_RDX;
  ParsedInternalKey ikey;
  Slice local_80;
  string local_70;
  InternalKey target;
  
  pIVar6 = DBImpl::TEST_NewInternalIterator((DBImpl *)this->db_);
  InternalKey::InternalKey(&target,user_key,0xffffffffffffff,kTypeValue);
  ikey.user_key = InternalKey::Encode(&target);
  (*pIVar6->_vptr_Iterator[5])(pIVar6);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  (*pIVar6->_vptr_Iterator[10])(&ikey,pIVar6);
  pcVar4 = ikey.user_key.data_;
  Status::~Status((Status *)&ikey);
  if (pcVar4 == (char *)0x0) {
    std::__cxx11::string::assign((char *)__return_storage_ptr__);
    bVar3 = true;
    while( true ) {
      iVar5 = (*pIVar6->_vptr_Iterator[2])(pIVar6);
      if ((char)iVar5 == '\0') break;
      ikey.user_key = (Slice)ZEXT816(0x16d8f5);
      iVar5 = (*pIVar6->_vptr_Iterator[8])(pIVar6);
      if (extraout_RDX < 8) {
LAB_001272ad:
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      else {
        uVar1 = *(ulong *)((char *)CONCAT44(extraout_var,iVar5) + (extraout_RDX - 8));
        ikey.type = (ValueType)uVar1 & 0xff;
        ikey.sequence = uVar1 >> 8;
        ikey.user_key.size_ = extraout_RDX - 8;
        ikey.user_key.data_ = (char *)CONCAT44(extraout_var,iVar5);
        if (kTypeValue < ikey.type) goto LAB_001272ad;
        pCVar2 = (this->last_options_).comparator;
        iVar5 = (*pCVar2->_vptr_Comparator[2])(pCVar2,&ikey,user_key);
        if (iVar5 != 0) break;
        if (!bVar3) {
          std::__cxx11::string::append((char *)__return_storage_ptr__);
        }
        if (ikey.type == kTypeDeletion) {
          std::__cxx11::string::append((char *)__return_storage_ptr__);
        }
        else if (ikey.type == kTypeValue) {
          iVar5 = (*pIVar6->_vptr_Iterator[9])(pIVar6);
          local_80.data_ = (char *)CONCAT44(extraout_var_00,iVar5);
          Slice::ToString_abi_cxx11_(&local_70,&local_80);
          std::__cxx11::string::append((string *)__return_storage_ptr__);
          std::__cxx11::string::_M_dispose();
        }
        bVar3 = false;
      }
      (*pIVar6->_vptr_Iterator[6])(pIVar6);
    }
    if (!bVar3) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  else {
    (*pIVar6->_vptr_Iterator[10])(&local_70,pIVar6);
    Status::ToString_abi_cxx11_((string *)&ikey,(Status *)&local_70);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&ikey);
    std::__cxx11::string::_M_dispose();
    Status::~Status((Status *)&local_70);
  }
  (*pIVar6->_vptr_Iterator[1])(pIVar6);
  std::__cxx11::string::_M_dispose();
  return __return_storage_ptr__;
}

Assistant:

std::string AllEntriesFor(const Slice& user_key) {
    Iterator* iter = dbfull()->TEST_NewInternalIterator();
    InternalKey target(user_key, kMaxSequenceNumber, kTypeValue);
    iter->Seek(target.Encode());
    std::string result;
    if (!iter->status().ok()) {
      result = iter->status().ToString();
    } else {
      result = "[ ";
      bool first = true;
      while (iter->Valid()) {
        ParsedInternalKey ikey;
        if (!ParseInternalKey(iter->key(), &ikey)) {
          result += "CORRUPTED";
        } else {
          if (last_options_.comparator->Compare(ikey.user_key, user_key) != 0) {
            break;
          }
          if (!first) {
            result += ", ";
          }
          first = false;
          switch (ikey.type) {
            case kTypeValue:
              result += iter->value().ToString();
              break;
            case kTypeDeletion:
              result += "DEL";
              break;
          }
        }
        iter->Next();
      }
      if (!first) {
        result += " ";
      }
      result += "]";
    }
    delete iter;
    return result;
  }